

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

QSize __thiscall QLabelPrivate::sizeForWidth(QLabelPrivate *this,int w)

{
  short sVar1;
  short sVar2;
  QWidget *this_00;
  Data *pDVar3;
  bool bVar4;
  bool bVar5;
  qreal width;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  int iVar10;
  int iVar11;
  LayoutDirection direction;
  Alignment AVar12;
  int iVar13;
  QSize QVar14;
  QStyle *pQVar15;
  undefined8 uVar16;
  Representation RVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  byte bVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  double dVar29;
  double extraout_XMM1_Qa;
  double dVar30;
  undefined1 auVar31 [16];
  QSizeF QVar32;
  QFontMetrics fm;
  QStyleOption opt;
  uint local_a8;
  undefined1 local_80 [8];
  undefined1 local_78 [12];
  undefined4 uStack_6c;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  QVar14 = QWidget::minimumSize(this_00);
  if (0 < QVar14.wd.m_i.m_i) {
    QVar14 = QWidget::minimumSize(this_00);
    if (w < QVar14.wd.m_i.m_i) {
      w = QVar14.wd.m_i.m_i;
    }
  }
  iVar20 = (int)(this->super_QFramePrivate).super_QWidgetPrivate.rightmargin +
           (int)(this->super_QFramePrivate).super_QWidgetPrivate.leftmargin;
  sVar1 = (this->super_QFramePrivate).super_QWidgetPrivate.topmargin;
  sVar2 = (this->super_QFramePrivate).super_QWidgetPrivate.bottommargin;
  iVar18 = this->margin * 2;
  local_80 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics((QFontMetrics *)local_80,&this_00->data->fnt);
  iVar22 = iVar18;
  if (((this->icon).super__Optional_base<QIcon,_false,_false>._M_payload.
       super__Optional_payload<QIcon,_true,_false,_false>.super__Optional_payload_base<QIcon>.
       _M_engaged == true) && (cVar9 = QIcon::isNull(), cVar9 == '\0')) {
    auVar8._4_4_ = (this->pixmapSize).ht.m_i + -1;
    auVar8._0_4_ = (this->pixmapSize).wd.m_i + -1;
    auVar8._8_8_ = 0;
    auVar31 = auVar8 << 0x40;
  }
  else if (((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
            super__Optional_payload<QPicture,_true,_false,_false>.
            super__Optional_payload_base<QPicture>._M_engaged == true) &&
          (cVar9 = QPicture::isNull(), cVar9 == '\0')) {
    if ((this->picture).super__Optional_base<QPicture,_false,_false>._M_payload.
        super__Optional_payload<QPicture,_true,_false,_false>.super__Optional_payload_base<QPicture>
        ._M_engaged == false) {
      sizeForWidth();
      goto LAB_0040fe4f;
    }
    auVar31 = QPicture::boundingRect();
  }
  else {
    pDVar3 = (this->movie).wp.d;
    if ((pDVar3 != (Data *)0x0) &&
       ((this->movie).wp.value != (QObject *)0x0 && *(int *)(pDVar3 + 4) != 0)) {
      QMovie::currentPixmap();
      cVar9 = QPixmap::isNull();
      QPixmap::~QPixmap((QPixmap *)local_78);
      if (cVar9 == '\0') {
        QMovie::currentPixmap();
        uVar16 = QPixmap::rect();
        QPixmap::~QPixmap((QPixmap *)local_78);
        QMovie::currentPixmap();
        dVar29 = (double)QPixmap::deviceIndependentSize();
        dVar29 = (double)(((ulong)dVar29 >> 0x20 & 0x80000000) << 0x20 | 0x3fe0000000000000) +
                 dVar29;
        bVar4 = 2147483647.0 < dVar29;
        if (dVar29 <= -2147483648.0) {
          dVar29 = -2147483648.0;
        }
        dVar30 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
        bVar5 = 2147483647.0 < dVar30;
        if (dVar30 <= -2147483648.0) {
          dVar30 = -2147483648.0;
        }
        auVar31._12_4_ =
             (int)((ulong)uVar16 >> 0x20) +
             (int)(double)(-(ulong)bVar5 & 0x41dfffffffc00000 | ~-(ulong)bVar5 & (ulong)dVar30) + -1
        ;
        auVar31._8_4_ =
             (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar29) +
             (int)uVar16 + -1;
        auVar31._0_8_ = uVar16;
        QPixmap::~QPixmap((QPixmap *)local_78);
        goto LAB_0040fd46;
      }
    }
    if ((this->field_0x340 & 0x10) == 0) {
      iVar10 = QFontMetrics::averageCharWidth();
      iVar11 = QFontMetrics::lineSpacing();
      auVar7._4_4_ = iVar11 + -1;
      auVar7._0_4_ = iVar10 + -1;
      auVar7._8_8_ = 0;
      auVar31 = auVar7 << 0x40;
    }
    else {
      direction = textDirection(this);
      AVar12 = QStyle::visualAlignment(direction,(Alignment)this->align);
      iVar10 = this->indent;
      if (iVar10 < 0) {
        iVar10 = QFrame::frameWidth((QFrame *)this_00);
        if (iVar10 != 0) {
          iVar10 = QFontMetrics::horizontalAdvance((QChar)(char16_t)local_80);
          iVar10 = iVar10 + this->margin * -2;
          goto LAB_0040f902;
        }
      }
      else {
LAB_0040f902:
        if (0 < iVar10) {
          iVar22 = iVar10 + iVar18;
          if (((uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i & 3) == 0) {
            iVar22 = iVar18;
          }
          if (((uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                     super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x60) != 0) {
            iVar18 = iVar10 + iVar18;
          }
        }
      }
      if (this->control == (QWidgetTextControl *)0x0) {
        uVar21 = (uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                       super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffff7b;
        if ((this->field_0x340 & 0x20) != 0) {
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          stack0xffffffffffffff90 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = (uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                           super_QFlagsStorage<Qt::AlignmentFlag>.i & 0xffffff7b;
          QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
          QStyleOption::initFrom((QStyleOption *)local_78,this_00);
          pQVar15 = QWidget::style(this_00);
          iVar10 = (**(code **)(*(long *)pQVar15 + 0xf0))(pQVar15,0x29,local_78,this_00);
          uVar21 = (uint)(iVar10 == 0) << 0xf | local_a8 | 0x800;
          QStyleOption::~QStyleOption((QStyleOption *)local_78);
        }
        bVar23 = (byte)((uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                              super_QFlagsStorage<Qt::AlignmentFlag>.i >> 0xc) & 1 & w < 0;
        if (bVar23 == 1) {
          iVar10 = QFontMetrics::averageCharWidth();
          QVar14 = QWidget::maximumSize(this_00);
          RVar17.m_i = QVar14.wd.m_i.m_i;
          if (iVar10 * 0x50 < QVar14.wd.m_i.m_i) {
            RVar17.m_i = iVar10 * 0x50;
          }
        }
        else {
          RVar17.m_i = 2000;
          if (-1 < w) {
            RVar17.m_i = w;
          }
        }
        iVar10 = RVar17.m_i - (iVar22 + iVar20);
        iVar11 = (int)this + 0x288;
        local_78._0_8_ = (undefined1 *)0x0;
        stack0xffffffffffffff90 = (undefined1 *)CONCAT44(1999,iVar10 + -1);
        auVar31 = QFontMetrics::boundingRect
                            ((QRect *)local_80,(int)local_78,(QString *)(ulong)uVar21,iVar11,
                             (int *)0x0);
        if (bVar23 != 0) {
          iVar26 = auVar31._4_4_;
          iVar24 = auVar31._12_4_;
          iVar25 = (iVar24 - iVar26) + 1;
          iVar13 = QFontMetrics::lineSpacing();
          if ((SBORROW4(iVar25,iVar13 * 4) != iVar25 + iVar13 * -4 < 0) &&
             (iVar10 / 2 < (auVar31._8_4_ - auVar31._0_4_) + 1)) {
            local_78._0_8_ = (undefined1 *)0x0;
            stack0xffffffffffffff90 = (undefined1 *)CONCAT44(1999,iVar10 / 2 + -1);
            auVar31 = QFontMetrics::boundingRect
                                ((QRect *)local_80,(int)local_78,(QString *)(ulong)uVar21,iVar11,
                                 (int *)0x0);
            iVar24 = auVar31._12_4_;
            iVar26 = auVar31._4_4_;
          }
          iVar26 = (iVar24 - iVar26) + 1;
          iVar13 = QFontMetrics::lineSpacing();
          if (SBORROW4(iVar26,iVar13 * 2) != iVar26 + iVar13 * -2 < 0) {
            iVar13 = iVar10 + 3;
            if (-1 < iVar10) {
              iVar13 = iVar10;
            }
            if (iVar13 >> 2 < (auVar31._8_4_ - auVar31._0_4_) + 1) {
              local_78._0_8_ = (undefined1 *)0x0;
              stack0xffffffffffffff90 = (undefined1 *)CONCAT44(1999,(iVar13 >> 2) + -1);
              auVar31 = QFontMetrics::boundingRect
                                  ((QRect *)local_80,(int)local_78,(QString *)(ulong)uVar21,iVar11,
                                   (int *)0x0);
            }
          }
        }
      }
      else {
        ensureTextLayouted(this);
        width = QWidgetTextControl::textWidth((QWidgetTextControl *)this->control);
        if (((uint)AVar12.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                   super_QFlagsStorage<Qt::AlignmentFlag>.i >> 0xc & 1) == 0) {
          QWidgetTextControl::setTextWidth((QWidgetTextControl *)this->control,-1.0);
        }
        else if (w < 0) {
          QWidgetTextControl::adjustSize((QWidgetTextControl *)this->control);
        }
        else {
          iVar11 = w - (iVar22 + iVar20);
          iVar10 = 0;
          if (0 < iVar11) {
            iVar10 = iVar11;
          }
          QWidgetTextControl::setTextWidth((QWidgetTextControl *)this->control,(double)iVar10);
        }
        QVar32 = QWidgetTextControl::size((QWidgetTextControl *)this->control);
        dVar29 = ceil(QVar32.wd);
        dVar30 = ceil(QVar32.ht);
        auVar6._4_4_ = (int)dVar30 + -1;
        auVar6._0_4_ = (int)dVar29 + -1;
        QWidgetTextControl::setTextWidth((QWidgetTextControl *)this->control,width);
        auVar6._8_8_ = 0;
        auVar31 = auVar6 << 0x40;
      }
    }
  }
LAB_0040fd46:
  uVar27 = iVar22 + (iVar20 - auVar31._0_4_) + auVar31._8_4_ + 1;
  uVar21 = auVar31._12_4_ + (((int)sVar1 + (int)sVar2) - auVar31._4_4_) + iVar18 + 1;
  QVar14 = QWidget::minimumSize(this_00);
  uVar19 = (ulong)QVar14 >> 0x20;
  uVar28 = (ulong)uVar27;
  if ((int)uVar27 <= QVar14.wd.m_i.m_i) {
    uVar28 = (ulong)QVar14 & 0xffffffff;
  }
  if (QVar14.ht.m_i.m_i < (int)uVar21) {
    uVar19 = (ulong)uVar21;
  }
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_80);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar28 | uVar19 << 0x20);
  }
LAB_0040fe4f:
  __stack_chk_fail();
}

Assistant:

QSize QLabelPrivate::sizeForWidth(int w) const
{
    Q_Q(const QLabel);
    if (q->minimumWidth() > 0)
        w = qMax(w, q->minimumWidth());
    QSize contentsMargin(leftmargin + rightmargin, topmargin + bottommargin);

    QRect br;

    int hextra = 2 * margin;
    int vextra = hextra;
    QFontMetrics fm = q->fontMetrics();

    if (icon && !icon->isNull()) {
        br = QRect(QPoint(0, 0), pixmapSize);
#ifndef QT_NO_PICTURE
    } else if (picture && !picture->isNull()) {
        br = picture->boundingRect();
#endif
#if QT_CONFIG(movie)
    } else if (movie && !movie->currentPixmap().isNull()) {
        br = movie->currentPixmap().rect();
        br.setSize(movie->currentPixmap().deviceIndependentSize().toSize());
#endif
    } else if (isTextLabel) {
        int align = QStyle::visualAlignment(textDirection(), QFlag(this->align));
        // Add indentation
        int m = indent;

        if (m < 0 && q->frameWidth()) // no indent, but we do have a frame
            m = fm.horizontalAdvance(u'x') - margin*2;
        if (m > 0) {
            if ((align & Qt::AlignLeft) || (align & Qt::AlignRight))
                hextra += m;
            if ((align & Qt::AlignTop) || (align & Qt::AlignBottom))
                vextra += m;
        }

        if (control) {
            ensureTextLayouted();
            const qreal oldTextWidth = control->textWidth();
            // Calculate the length of document if w is the width
            if (align & Qt::TextWordWrap) {
                if (w >= 0) {
                    w = qMax(w-hextra-contentsMargin.width(), 0); // strip margin and indent
                    control->setTextWidth(w);
                } else {
                    control->adjustSize();
                }
            } else {
                control->setTextWidth(-1);
            }

            QSizeF controlSize = control->size();
            br = QRect(QPoint(0, 0), QSize(qCeil(controlSize.width()), qCeil(controlSize.height())));

            // restore state
            control->setTextWidth(oldTextWidth);
        } else {
            // Turn off center alignment in order to avoid rounding errors for centering,
            // since centering involves a division by 2. At the end, all we want is the size.
            int flags = align & ~(Qt::AlignVCenter | Qt::AlignHCenter);
            if (hasShortcut) {
                flags |= Qt::TextShowMnemonic;
                QStyleOption opt;
                opt.initFrom(q);
                if (!q->style()->styleHint(QStyle::SH_UnderlineShortcut, &opt, q))
                    flags |= Qt::TextHideMnemonic;
            }

            bool tryWidth = (w < 0) && (align & Qt::TextWordWrap);
            if (tryWidth)
                w = qMin(fm.averageCharWidth() * 80, q->maximumSize().width());
            else if (w < 0)
                w = 2000;
            w -= (hextra + contentsMargin.width());
            br = fm.boundingRect(0, 0, w ,2000, flags, text);
            if (tryWidth && br.height() < 4*fm.lineSpacing() && br.width() > w/2)
                br = fm.boundingRect(0, 0, w/2, 2000, flags, text);
            if (tryWidth && br.height() < 2*fm.lineSpacing() && br.width() > w/4)
                br = fm.boundingRect(0, 0, w/4, 2000, flags, text);
        }
    } else {
        br = QRect(QPoint(0, 0), QSize(fm.averageCharWidth(), fm.lineSpacing()));
    }

    const QSize contentsSize(br.width() + hextra, br.height() + vextra);
    return (contentsSize + contentsMargin).expandedTo(q->minimumSize());
}